

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmTarget *this_01;
  ostream *poVar4;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  bool bVar5;
  MessageType t;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  this_01 = FindTarget(this,targetName,false);
  if (this_01 == (cmTarget *)0x0) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  PVar3 = cmPolicies::PolicyMap::Get(&this_01->PolicyMap,CMP0037);
  if (PVar3 - NEW < 3) {
    t = FATAL_ERROR;
    bVar2 = true;
    bVar5 = false;
LAB_00314605:
    bVar1 = true;
  }
  else {
    if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x25,id);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
      bVar5 = true;
      t = AUTHOR_WARNING;
      goto LAB_00314605;
    }
    bVar2 = false;
    bVar5 = true;
    t = AUTHOR_WARNING;
    bVar1 = false;
  }
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The target name \"",0x11);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(targetName->_M_dataplus)._M_p,
                        targetName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" is reserved ",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(reason->_M_dataplus)._M_p,reason->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"  It may result in undefined behavior.",0x26);
    }
    this_00 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    backtrace = cmTarget::GetBacktrace(this_01);
    cmake::IssueMessage(this_00,t,&local_1c8,backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar5 = false;
      goto LAB_003146f3;
    }
  }
  bVar5 = true;
LAB_003146f3:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return bVar5;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (tgt->GetPolicyStatusCMP0037()) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
      issueMessage = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName << "\" is reserved " << reason
      << ".";
    if (messageType == MessageType::AUTHOR_WARNING) {
      e << "  It may result in undefined behavior.";
    }
    this->GetCMakeInstance()->IssueMessage(messageType, e.str(),
                                           tgt->GetBacktrace());
    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}